

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void stbi__jpeg_finish(stbi__jpeg *z)

{
  int iVar1;
  long lVar2;
  short *data_00;
  long *in_RDI;
  short *data;
  int h;
  int w;
  int n;
  int j;
  int i;
  int local_14;
  int local_10;
  int local_c;
  
  if ((int)in_RDI[0x906] != 0) {
    for (local_14 = 0; local_14 < *(int *)(*in_RDI + 8); local_14 = local_14 + 1) {
      iVar1 = *(int *)((long)in_RDI + (long)local_14 * 0x60 + 0x46bc);
      lVar2 = in_RDI[(long)local_14 * 0xc + 0x8d8];
      for (local_10 = 0; local_10 < (int)lVar2 + 7 >> 3; local_10 = local_10 + 1) {
        for (local_c = 0; local_c < iVar1 + 7 >> 3; local_c = local_c + 1) {
          data_00 = (short *)(in_RDI[(long)local_14 * 0xc + 0x8de] +
                             (long)((local_c + local_10 * (int)in_RDI[(long)local_14 * 0xc + 0x8df])
                                   * 0x40) * 2);
          stbi__jpeg_dequantize
                    (data_00,(stbi__uint16 *)
                             (in_RDI + (long)*(int *)((long)in_RDI + (long)local_14 * 0x60 + 0x46ac)
                                       * 0x10 + 0x691));
          (*(code *)in_RDI[0x90e])
                    (in_RDI[(long)local_14 * 0xc + 0x8da] +
                     (long)(*(int *)((long)in_RDI + (long)local_14 * 0x60 + 0x46c4) * local_10 * 8)
                     + (long)(local_c << 3),
                     *(undefined4 *)((long)in_RDI + (long)local_14 * 0x60 + 0x46c4),data_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void stbi__jpeg_finish(stbi__jpeg *z)
{
   if (z->progressive) {
      // dequantize and idct the data
      int i,j,n;
      for (n=0; n < z->s->img_n; ++n) {
         int w = (z->img_comp[n].x+7) >> 3;
         int h = (z->img_comp[n].y+7) >> 3;
         for (j=0; j < h; ++j) {
            for (i=0; i < w; ++i) {
               short *data = z->img_comp[n].coeff + 64 * (i + j * z->img_comp[n].coeff_w);
               stbi__jpeg_dequantize(data, z->dequant[z->img_comp[n].tq]);
               z->idct_block_kernel(z->img_comp[n].data+z->img_comp[n].w2*j*8+i*8, z->img_comp[n].w2, data);
            }
         }
      }
   }
}